

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTransform.h
# Opt level: O0

ChVector<double> *
chrono::ChTransform<double>::TransformLocalToParent
          (ChVector<double> *__return_storage_ptr__,ChVector<double> *local,ChVector<double> *origin
          ,ChQuaternion<double> *alignment)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double *pdVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double e2e3;
  double e1e3;
  double e1e2;
  double e0e3;
  double e0e2;
  double e0e1;
  double e3e3;
  double e2e2;
  double e1e1;
  double e0e0;
  ChQuaternion<double> *alignment_local;
  ChVector<double> *origin_local;
  ChVector<double> *local_local;
  
  pdVar21 = ChQuaternion<double>::e0(alignment);
  dVar1 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e0(alignment);
  dVar1 = dVar1 * *pdVar21;
  pdVar21 = ChQuaternion<double>::e1(alignment);
  dVar2 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e1(alignment);
  dVar3 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e2(alignment);
  dVar4 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e2(alignment);
  dVar5 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e3(alignment);
  dVar6 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e3(alignment);
  dVar7 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e0(alignment);
  dVar8 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e1(alignment);
  dVar9 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e0(alignment);
  dVar10 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e2(alignment);
  dVar11 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e0(alignment);
  dVar12 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e3(alignment);
  dVar13 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e1(alignment);
  dVar14 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e2(alignment);
  dVar15 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e1(alignment);
  dVar16 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e3(alignment);
  dVar17 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e2(alignment);
  dVar18 = *pdVar21;
  pdVar21 = ChQuaternion<double>::e3(alignment);
  dVar19 = *pdVar21;
  pdVar21 = ChVector<double>::x(origin);
  dVar20 = *pdVar21;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1 + dVar2 * dVar3;
  auVar22 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar30,ZEXT816(0xbff0000000000000));
  pdVar21 = ChVector<double>::x(local);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar20;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar22._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *pdVar21;
  auVar22 = vfmadd213sd_fma(auVar22,auVar31,auVar41);
  pdVar21 = ChVector<double>::y(local);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar22._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = (dVar14 * dVar15 - dVar12 * dVar13) * 2.0;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *pdVar21;
  auVar22 = vfmadd213sd_fma(auVar23,auVar32,auVar42);
  pdVar21 = ChVector<double>::z(local);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auVar22._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = (dVar16 * dVar17 + dVar10 * dVar11) * 2.0;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *pdVar21;
  auVar22 = vfmadd213sd_fma(auVar24,auVar33,auVar43);
  pdVar21 = ChVector<double>::y(origin);
  dVar2 = *pdVar21;
  pdVar21 = ChVector<double>::x(local);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = (dVar14 * dVar15 + dVar12 * dVar13) * 2.0;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *pdVar21;
  auVar23 = vfmadd213sd_fma(auVar25,auVar34,auVar44);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar1 + dVar4 * dVar5;
  auVar24 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar35,ZEXT816(0xbff0000000000000));
  pdVar21 = ChVector<double>::y(local);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = auVar23._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar24._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *pdVar21;
  auVar23 = vfmadd213sd_fma(auVar26,auVar36,auVar45);
  pdVar21 = ChVector<double>::z(local);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = auVar23._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = (dVar18 * dVar19 - dVar8 * dVar9) * 2.0;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *pdVar21;
  auVar23 = vfmadd213sd_fma(auVar27,auVar37,auVar46);
  pdVar21 = ChVector<double>::z(origin);
  dVar2 = *pdVar21;
  pdVar21 = ChVector<double>::x(local);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = (dVar16 * dVar17 - dVar10 * dVar11) * 2.0;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *pdVar21;
  auVar24 = vfmadd213sd_fma(auVar28,auVar38,auVar47);
  pdVar21 = ChVector<double>::y(local);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = auVar24._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = (dVar18 * dVar19 + dVar8 * dVar9) * 2.0;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *pdVar21;
  auVar24 = vfmadd213sd_fma(auVar29,auVar39,auVar48);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1 + dVar6 * dVar7;
  auVar25 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar40,ZEXT816(0xbff0000000000000));
  pdVar21 = ChVector<double>::z(local);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = auVar24._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = auVar25._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *pdVar21;
  auVar24 = vfmadd213sd_fma(auVar49,auVar50,auVar51);
  ChVector<double>::ChVector(__return_storage_ptr__,auVar22._0_8_,auVar23._0_8_,auVar24._0_8_);
  return __return_storage_ptr__;
}

Assistant:

static ChVector<Real> TransformLocalToParent(
        const ChVector<Real>& local,         ///< point to transform, given in local coordinates
        const ChVector<Real>& origin,        ///< origin of frame respect to parent, in parent coords,
        const ChQuaternion<Real>& alignment  ///< rotation of frame respect to parent, in parent coords.
        ) {
        // It could be simply: "return origin+alignment.Rotate(local);"
        // but for faster execution, do this:
        Real e0e0 = alignment.e0() * alignment.e0();
        Real e1e1 = alignment.e1() * alignment.e1();
        Real e2e2 = alignment.e2() * alignment.e2();
        Real e3e3 = alignment.e3() * alignment.e3();
        Real e0e1 = alignment.e0() * alignment.e1();
        Real e0e2 = alignment.e0() * alignment.e2();
        Real e0e3 = alignment.e0() * alignment.e3();
        Real e1e2 = alignment.e1() * alignment.e2();
        Real e1e3 = alignment.e1() * alignment.e3();
        Real e2e3 = alignment.e2() * alignment.e3();
        return ChVector<Real>(origin.x() + ((e0e0 + e1e1) * 2. - 1.) * local.x() + ((e1e2 - e0e3) * 2.) * local.y() +
                                  ((e1e3 + e0e2) * 2.) * local.z(),
                              origin.y() + ((e1e2 + e0e3) * 2.) * local.x() + ((e0e0 + e2e2) * 2. - 1.) * local.y() +
                                  ((e2e3 - e0e1) * 2.) * local.z(),
                              origin.z() + ((e1e3 - e0e2) * 2.) * local.x() + ((e2e3 + e0e1) * 2.) * local.y() +
                                  ((e0e0 + e3e3) * 2. - 1.) * local.z());
    }